

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O1

void cfl_predict_lbd_32x8_c(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  int iVar1;
  int i;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = 0;
  do {
    lVar2 = 0;
    do {
      iVar3 = pred_buf_q3[lVar2] * alpha_q3;
      if (iVar3 < 0) {
        uVar4 = -(0x20U - iVar3 >> 6);
      }
      else {
        uVar4 = iVar3 + 0x20U >> 6;
      }
      iVar3 = dst[lVar2] + uVar4;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      dst[lVar2] = (uint8_t)iVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    dst = dst + dst_stride;
    pred_buf_q3 = pred_buf_q3 + 0x20;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 8);
  return;
}

Assistant:

static inline void cfl_predict_hbd_c(const int16_t *ac_buf_q3, uint16_t *dst,
                                     int dst_stride, int alpha_q3,
                                     int bit_depth, int width, int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel_highbd(
          get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i], bit_depth);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}